

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

QPainterPath __thiscall QPainterPath::united(QPainterPath *this,QPainterPath *p)

{
  long lVar1;
  bool bVar2;
  QPathClipper *in_RDX;
  QPathClipper *in_RSI;
  QPainterPathPrivate *in_RDI;
  long in_FS_OFFSET;
  QPathClipper clipper;
  QPainterPath *in_stack_ffffffffffffff98;
  QPathClipper *in_stack_ffffffffffffffa0;
  QExplicitlySharedDataPointer<QPainterPathPrivate> this_00;
  QPathClipper *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QPainterPathPrivate_*>)
       (totally_ordered_wrapper<QPainterPathPrivate_*>)in_RDI;
  this_01 = in_RSI;
  bVar2 = isEmpty((QPainterPath *)in_RDI);
  if ((bVar2) || (bVar2 = isEmpty((QPainterPath *)this_00.d.ptr), bVar2)) {
    bVar2 = isEmpty((QPainterPath *)this_00.d.ptr);
    if (!bVar2) {
      in_RDX = in_RSI;
    }
    QPainterPath(&in_RDX->subjectPath,in_stack_ffffffffffffff98);
  }
  else {
    QPathClipper::QPathClipper
              ((QPathClipper *)this_00.d.ptr,(QPainterPath *)in_RDI,
               &in_stack_ffffffffffffffa0->subjectPath);
    QPathClipper::clip(this_01,(Operation)((ulong)in_RDX >> 0x20));
    QPathClipper::~QPathClipper(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)this_00.d.ptr;
}

Assistant:

QPainterPath QPainterPath::united(const QPainterPath &p) const
{
    if (isEmpty() || p.isEmpty())
        return isEmpty() ? p : *this;
    QPathClipper clipper(*this, p);
    return clipper.clip(QPathClipper::BoolOr);
}